

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

void __thiscall rtosc::Ports::dispatch(Ports *this,char *m,RtData *d,bool base_dispatch)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  Port_Matcher *pPVar4;
  int *piVar5;
  Port *pPVar6;
  pointer piVar7;
  pointer pPVar8;
  pointer pbVar9;
  char *pcVar10;
  _Bool _Var11;
  bool bVar12;
  iterator __begin3;
  int *piVar13;
  char *pcVar14;
  int iVar15;
  undefined7 in_register_00000009;
  int iVar16;
  long lVar17;
  ulong uVar18;
  Port *port;
  Port *pPVar19;
  char *pcVar20;
  char *m_end;
  char *local_60;
  void *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  Ports *local_38;
  
  local_58 = d->obj;
  if ((int)CONCAT71(in_register_00000009,base_dispatch) != 0) {
    d->matches = 0;
    d->message = m;
    if (m == (char *)0x0) {
      m = (char *)0x0;
    }
    else {
      m = m + (*m == '/');
    }
    if (d->loc != (char *)0x0) {
      *d->loc = '\0';
    }
  }
  pcVar3 = d->loc;
  if ((pcVar3 == (char *)0x0) || (d->loc_size == 0)) {
    pPVar19 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
              super__Vector_impl_data._M_start;
    pPVar6 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pPVar19 != pPVar6) {
      do {
        _Var11 = rtosc_match(pPVar19->name,m,(char **)0x0);
        if (_Var11) {
          d->port = pPVar19;
          if ((pPVar19->cb).super__Function_base._M_manager == (_Manager_type)0x0)
          goto LAB_00105db0;
          local_60 = m;
          (*(pPVar19->cb)._M_invoker)((_Any_data *)&pPVar19->cb,&local_60,d);
          d->obj = local_58;
        }
        pPVar19 = pPVar19 + 1;
      } while (pPVar19 != pPVar6);
    }
  }
  else {
    if (*pcVar3 == '\0') {
      memset(pcVar3,0,d->loc_size);
      *d->loc = '/';
    }
    pcVar3 = d->loc + -1;
    do {
      pcVar14 = pcVar3;
      pcVar3 = pcVar14 + 1;
    } while (pcVar14[1] != '\0');
    pPVar4 = this->impl;
    piVar13 = (pPVar4->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar5 = (pPVar4->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar13 == piVar5) {
      if (this->elms != 0) {
        local_40 = pcVar14 + 2;
        local_48 = m + 1;
        uVar18 = 0;
        local_38 = this;
        do {
          pPVar8 = (local_38->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          _Var11 = rtosc_match(pPVar8[uVar18].name,m,&local_50);
          if (_Var11) {
            pPVar19 = pPVar8 + uVar18;
            if (pPVar19->ports == (Ports *)0x0) {
              d->matches = d->matches + 1;
            }
            pcVar14 = pPVar19->name;
            pcVar20 = strchr(pcVar14,0x23);
            if (pcVar20 == (char *)0x0) {
              pcVar20 = d->loc + -1;
              do {
                pcVar1 = pcVar20 + 1;
                pcVar20 = pcVar20 + 1;
              } while (*pcVar1 != '\0');
              for (lVar17 = 0; (cVar2 = pcVar14[lVar17], cVar2 != '\0' && (cVar2 != ':'));
                  lVar17 = lVar17 + 1) {
                pcVar20[lVar17] = cVar2;
              }
              pcVar20 = pcVar20 + lVar17;
            }
            else {
              cVar2 = *m;
              pcVar20 = pcVar3;
              pcVar1 = local_48;
              pcVar14 = m;
              if (cVar2 != '\0') {
                while (pcVar10 = pcVar1, pcVar14 != local_50) {
                  *pcVar20 = cVar2;
                  pcVar20 = pcVar20 + 1;
                  cVar2 = *pcVar10;
                  if (cVar2 == '\0') break;
                  pcVar1 = pcVar10 + 1;
                  pcVar14 = pcVar10;
                }
              }
            }
            *pcVar20 = '\0';
            d->port = pPVar19;
            if ((pPVar19->cb).super__Function_base._M_manager == (_Manager_type)0x0)
            goto LAB_00105db0;
            local_60 = m;
            (*(pPVar19->cb)._M_invoker)((_Any_data *)&pPVar19->cb,&local_60,d);
            d->obj = local_58;
            cVar2 = *pcVar3;
            pcVar14 = local_40;
            while (cVar2 != '\0') {
              pcVar14[-1] = '\0';
              cVar2 = *pcVar14;
              pcVar14 = pcVar14 + 1;
            }
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < local_38->elms);
      }
    }
    else {
      for (lVar17 = 0; (cVar2 = m[lVar17], cVar2 != '\0' && (cVar2 != '/')); lVar17 = lVar17 + 1) {
      }
      uVar18 = (ulong)(cVar2 == '/') + lVar17;
      iVar15 = (int)uVar18;
      iVar16 = iVar15;
      if (piVar13 != piVar5) {
        uVar18 = uVar18 & 0xffffffff;
        do {
          if (*piVar13 < iVar15) {
            uVar18 = (ulong)(uint)((int)uVar18 +
                                  (pPVar4->assoc).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[m[*piVar13]]);
          }
          iVar16 = (int)uVar18;
          piVar13 = piVar13 + 1;
        } while (piVar13 != piVar5);
      }
      piVar7 = (pPVar4->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar15 = (int)((ulong)((long)(pPVar4->remap).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar7) >> 2);
      if ((iVar16 < iVar15) ||
         ((this->default_handler).super__Function_base._M_manager != (_Manager_type)0x0)) {
        if ((iVar16 < iVar15) ||
           ((this->default_handler).super__Function_base._M_manager == (_Manager_type)0x0)) {
          iVar15 = piVar7[iVar16];
          bVar12 = Port_Matcher::hard_match(pPVar4,iVar15,m);
          if (bVar12) {
            pPVar8 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pPVar4 = this->impl;
            iVar16 = (pPVar4->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar16];
            if (pPVar8[iVar16].ports == (Ports *)0x0) {
              d->matches = d->matches + 1;
            }
            pPVar19 = pPVar8 + iVar16;
            pcVar14 = m;
            pcVar20 = pcVar3;
            if (pPVar4->m_enump[iVar15] == true) {
              for (; (cVar2 = *pcVar14, cVar2 != '\0' && (cVar2 != '/')); pcVar14 = pcVar14 + 1) {
                *pcVar20 = cVar2;
                pcVar20 = pcVar20 + 1;
              }
              pcVar14 = strchr(pPVar19->name,0x2f);
              if (pcVar14 != (char *)0x0) {
                *pcVar20 = '/';
                pcVar20 = pcVar20 + 1;
              }
              *pcVar20 = '\0';
            }
            else {
              pbVar9 = (pPVar4->fixed).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              memcpy(pcVar3,pbVar9[iVar15]._M_dataplus._M_p,pbVar9[iVar15]._M_string_length + 1);
            }
            d->port = pPVar19;
            if ((pPVar19->cb).super__Function_base._M_manager != (_Manager_type)0x0) {
              local_60 = m;
              (*(pPVar19->cb)._M_invoker)((_Any_data *)&pPVar19->cb,&local_60,d);
              d->obj = local_58;
              *pcVar3 = '\0';
              return;
            }
LAB_00105db0:
            local_60 = m;
            std::__throw_bad_function_call();
          }
          if ((this->default_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
            return;
          }
        }
        d->matches = d->matches + 1;
        local_60 = m;
        (*(this->default_handler)._M_invoker)((_Any_data *)&this->default_handler,&local_60,d);
        d->obj = local_58;
      }
    }
  }
  return;
}

Assistant:

void Ports::dispatch(const char *m, rtosc::RtData &d, bool base_dispatch) const
{
    // rRecur*Cb have already set d.loc to the required pointer
    // in case no port will match, d.loc will not be touched
    // this enables returning the address of a runtime object

    void *obj = d.obj;

    //handle the first dispatch layer
    if(base_dispatch) {
        d.matches = 0;
        d.message = m;
        if(m && *m == '/')
            m++;
        if(d.loc)
            d.loc[0] = 0;
    }

    //simple case
    if(!d.loc || !d.loc_size) {
        for(const Port &port: ports) {
            if(rtosc_match(port.name,m, NULL))
                d.port = &port, port.cb(m,d), d.obj = obj;
        }
    } else {

        //TODO this function is certainly buggy at the moment, some tests
        //are needed to make it clean
        //XXX buffer_size is not properly handled yet
        if(__builtin_expect(d.loc[0] == 0, 0)) {
            memset(d.loc, 0, d.loc_size);
            d.loc[0] = '/';
        }

        char *old_end = d.loc;
        while(*old_end) ++old_end;

        if(impl->pos.empty()) { //No perfect minimal hash function
            for(unsigned i=0; i<elms; ++i) {
                const Port &port = ports[i];
                const char* m_end;
                if(!rtosc_match(port.name, m, &m_end))
                    continue;
                if(!port.ports)
                    d.matches++;

                //Append the path
                if(strchr(port.name,'#')) {
                    const char *msg = m;
                    char       *pos = old_end;
                    while(*msg && msg != m_end)
                        *pos++ = *msg++;
                    *pos = '\0';
                } else
                    scat(d.loc, port.name);

                d.port = &port;

                //Apply callback
                port.cb(m,d), d.obj = obj;

                //Remove the rest of the path
                char *tmp = old_end;
                while(*tmp) *tmp++=0;
            }
        } else {

            //Define string to be hashed
            unsigned len=0;
            const char *tmp = m;

            while(*tmp && *tmp != '/')
                tmp++;
            if(*tmp == '/')
                tmp++;
            len = tmp-m;

            //Compute the hash
            int t = len;
            for(auto p:impl->pos)
                if(p < (int)len)
                    t += impl->assoc[m[p]];
            if(t >= (int)impl->remap.size() && !default_handler)
                return;
            else if(t >= (int)impl->remap.size() && default_handler) {
                d.matches++;
                default_handler(m,d), d.obj = obj;
                return;
            }

            int port_num = impl->remap[t];

            //Verify the chosen port is correct
            if(__builtin_expect(impl->hard_match(port_num, m), 1)) {
                const Port &port = ports[impl->remap[t]];
                if(!port.ports)
                    d.matches++;

                //Append the path
                if(impl->enump()[port_num]) {
                    const char *msg = m;
                    char       *pos = old_end;
                    while(*msg && *msg != '/')
                        *pos++ = *msg++;
                    if(strchr(port.name, '/'))
                        *pos++ = '/';
                    *pos = '\0';
                } else
                    memcpy(old_end, impl->fixed[port_num].c_str(),
                            impl->fixed[port_num].length()+1);

                d.port = &port;

                //Apply callback
                port.cb(m,d), d.obj = obj;

                //Remove the rest of the path
                old_end[0] = '\0';
            } else if(default_handler) {
                d.matches++;
                default_handler(m,d), d.obj = obj;
            }
        }
    }
}